

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleRPathChangeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmSystemToolsFileTime *t;
  size_t sVar7;
  ostream *poVar8;
  int iVar9;
  pointer pbVar10;
  uint uVar11;
  ulong uVar12;
  bool changed;
  string emsg;
  string file;
  ostringstream e;
  bool local_221;
  cmCommand *local_220;
  pointer local_218;
  string local_210;
  string local_1f0;
  pointer local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar9 = 0;
  local_220 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) < 0x21) {
    local_218 = (pointer)0x0;
    local_1d0 = (char *)0x0;
  }
  else {
    uVar12 = 1;
    uVar11 = 2;
    local_1d0 = (pointer)0x0;
    local_218 = (pointer)0x0;
    do {
      iVar6 = std::__cxx11::string::compare((char *)(pbVar10 + uVar12));
      if (iVar6 == 0) {
        iVar9 = 2;
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar6 == 0) {
          iVar9 = 3;
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar6 == 0) {
            iVar9 = 1;
          }
          else {
            if (iVar9 == 3) {
              local_218 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p;
            }
            else {
              if (iVar9 != 2) {
                if (iVar9 == 1) {
                  iVar9 = 0;
                  std::__cxx11::string::_M_assign((string *)&local_1f0);
                  goto LAB_00202a08;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"RPATH_CHANGE given unknown argument ",0x24);
                pbVar10 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pbVar10[uVar12]._M_dataplus._M_p,
                           pbVar10[uVar12]._M_string_length);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(local_220,&local_210);
                goto LAB_00202f3a;
              }
              local_1d0 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p;
            }
            iVar9 = 0;
          }
        }
      }
LAB_00202a08:
      uVar12 = (ulong)uVar11;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar11 + 1;
    } while (uVar12 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5
                             ));
  }
  pcVar3 = local_1d0;
  if (local_1f0._M_string_length == 0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"RPATH_CHANGE not given FILE option.","");
    cmCommand::SetError(local_220,(string *)local_1a8);
LAB_00202e40:
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  else {
    if (local_1d0 == (char *)0x0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"RPATH_CHANGE not given OLD_RPATH option.","");
      cmCommand::SetError(local_220,(string *)local_1a8);
      goto LAB_00202e40;
    }
    if (local_218 == (pointer)0x0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"RPATH_CHANGE not given NEW_RPATH option.","");
      cmCommand::SetError(local_220,(string *)local_1a8);
      goto LAB_00202e40;
    }
    bVar4 = cmsys::SystemTools::FileExists(&local_1f0,true);
    if (bVar4) {
      t = cmSystemTools::FileTimeNew();
      bVar4 = cmSystemTools::FileTimeGet(&local_1f0,t);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      pcVar2 = local_1a8 + 0x10;
      local_1a8._0_8_ = pcVar2;
      sVar7 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar3,pcVar3 + sVar7);
      pcVar3 = local_218;
      paVar1 = &local_1c8.field_2;
      local_1c8._M_dataplus._M_p = (pointer)paVar1;
      sVar7 = strlen(local_218);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar3,pcVar3 + sVar7);
      bVar5 = cmSystemTools::ChangeRPath
                        (&local_1f0,(string *)local_1a8,&local_1c8,&local_210,&local_221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (bVar5) {
LAB_00202c9d:
        if (local_221 == true) {
          local_1a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"Set runtime path of \"","");
          std::__cxx11::string::_M_append(local_1a8,(ulong)local_1f0._M_dataplus._M_p);
          std::__cxx11::string::append(local_1a8);
          std::__cxx11::string::append(local_1a8);
          std::__cxx11::string::append(local_1a8);
          cmMakefile::DisplayStatus(local_220->Makefile,(string *)local_1a8,-1.0);
          if ((pointer)local_1a8._0_8_ != pcVar2) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
        }
        if (bVar4) {
          cmSystemTools::FileTimeSet(&local_1f0,t);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"RPATH_CHANGE could not write new RPATH:\n",0x28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        pcVar3 = local_218;
        sVar7 = strlen(local_218);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"to the file:\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                            local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_210._M_dataplus._M_p,local_210._M_string_length);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_220,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if (bVar5) goto LAB_00202c9d;
      }
      cmSystemTools::FileTimeDelete(t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                 local_210.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_00202f78;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"RPATH_CHANGE given FILE \"",0x19);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" that does not exist.",0x16);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(local_220,&local_210);
LAB_00202f3a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                               local_210.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  bVar5 = false;
LAB_00202f78:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool cmFileCommand::HandleRPathChangeCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  const char* oldRPath = nullptr;
  const char* newRPath = nullptr;
  enum Doing
  {
    DoingNone,
    DoingFile,
    DoingOld,
    DoingNew
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "OLD_RPATH") {
      doing = DoingOld;
    } else if (args[i] == "NEW_RPATH") {
      doing = DoingNew;
    } else if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else if (doing == DoingOld) {
      oldRPath = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingNew) {
      newRPath = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_CHANGE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_CHANGE not given FILE option.");
    return false;
  }
  if (!oldRPath) {
    this->SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
  }
  if (!newRPath) {
    this->SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_CHANGE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool changed;
  if (!cmSystemTools::ChangeRPath(file, oldRPath, newRPath, &emsg, &changed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_CHANGE could not write new RPATH:\n"
      << "  " << newRPath << "\n"
      << "to the file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (changed) {
      std::string message = "Set runtime path of \"";
      message += file;
      message += "\" to \"";
      message += newRPath;
      message += "\"";
      this->Makefile->DisplayStatus(message, -1);
    }
    if (have_ft) {
      cmSystemTools::FileTimeSet(file, ft);
    }
  }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}